

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.c
# Opt level: O0

bc_slist_t * blogc_split_list_variable(char *name,bc_trie_t *global,bc_trie_t *local)

{
  char *str;
  char **__ptr;
  long local_48;
  size_t i;
  char **tmp;
  bc_slist_t *rv;
  char *value;
  bc_trie_t *local_local;
  bc_trie_t *global_local;
  char *name_local;
  
  str = blogc_get_variable(name,global,local);
  if (str == (char *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    tmp = (char **)0x0;
    __ptr = bc_str_split(str,' ',0);
    for (local_48 = 0; __ptr[local_48] != (char *)0x0; local_48 = local_48 + 1) {
      if (*__ptr[local_48] == '\0') {
        free(__ptr[local_48]);
      }
      else {
        tmp = (char **)bc_slist_append((bc_slist_t *)tmp,__ptr[local_48]);
      }
    }
    free(__ptr);
    name_local = (char *)tmp;
  }
  return (bc_slist_t *)name_local;
}

Assistant:

bc_slist_t*
blogc_split_list_variable(const char *name, bc_trie_t *global, bc_trie_t *local)
{
    const char *value = blogc_get_variable(name, global, local);
    if (value == NULL)
        return NULL;

    bc_slist_t *rv = NULL;

    char **tmp = bc_str_split(value, ' ', 0);
    for (size_t i = 0; tmp[i] != NULL; i++) {
        if (tmp[i][0] != '\0')  // ignore empty strings
            rv = bc_slist_append(rv, tmp[i]);
        else
            free(tmp[i]);
    }
    free(tmp);

    return rv;
}